

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * __thiscall CTPNListBase::get_const_ele(CTPNListBase *this,int index)

{
  int in_ESI;
  long in_RDI;
  CTPNListEle *ele;
  CTPNListEleBase *local_20;
  int local_14;
  CTcPrsNode *local_8;
  
  if (in_ESI < 1) {
    CTcTokenizer::log_error(0x2b10);
    local_8 = (CTcPrsNode *)0x0;
  }
  else {
    local_20 = *(CTPNListEleBase **)(in_RDI + 0x10);
    for (local_14 = in_ESI; local_20 != (CTPNListEleBase *)0x0 && 1 < local_14;
        local_14 = local_14 + -1) {
      local_20 = &CTPNListEleBase::get_next(local_20)->super_CTPNListEleBase;
    }
    if ((local_20 == (CTPNListEleBase *)0x0) || (local_14 != 1)) {
      CTcTokenizer::log_error(0x2b10);
      local_8 = (CTcPrsNode *)0x0;
    }
    else {
      local_8 = CTPNListEleBase::get_expr(local_20);
    }
  }
  return local_8;
}

Assistant:

CTcPrsNode *CTPNListBase::get_const_ele(int index)
{
    CTPNListEle *ele;
    
    /* if the index is negative, it's out of range */
    if (index < 1)
    {
        /* log the error and return failure */
        G_tok->log_error(TCERR_CONST_IDX_RANGE);
        return 0;
    }

    /* scan the list for the given element */
    for (ele = head_ ; ele != 0 && index > 1 ;
         ele = ele->get_next(), --index) ;

    /* if we ran out of elements, the index is out of range */
    if (ele == 0 || index != 1)
    {
        G_tok->log_error(TCERR_CONST_IDX_RANGE);
        return 0;
    }

    /* return the element's constant value */
    return ele->get_expr();
}